

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalculateProbability.cc
# Opt level: O0

JointProbabilityState *
calculateJointProbability(uint *firstVector,uint *secondVector,int vectorLength)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int in_ECX;
  ulong uVar4;
  long in_RDX;
  long in_RSI;
  JointProbabilityState *in_RDI;
  double dVar5;
  int i_3;
  int i_2;
  int i_1;
  double length;
  int i;
  double *jointStateProbs;
  double *secondStateProbs;
  double *firstStateProbs;
  int *jointStateCounts;
  int *secondStateCounts;
  int *firstStateCounts;
  int jointNumStates;
  int secondNumStates;
  int firstNumStates;
  int local_6c;
  int local_68;
  int local_64;
  int local_54;
  
  __ptr = calloc(6,4);
  __ptr_00 = calloc(6,4);
  __ptr_01 = calloc(0x24,4);
  pdVar1 = (double *)calloc(6,8);
  pdVar2 = (double *)calloc(6,8);
  pdVar3 = (double *)calloc(0x24,8);
  for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
    uVar4 = (ulong)*(uint *)(in_RSI + (long)local_54 * 4);
    *(int *)((long)__ptr + uVar4 * 4) = *(int *)((long)__ptr + uVar4 * 4) + 1;
    uVar4 = (ulong)*(uint *)(in_RDX + (long)local_54 * 4);
    *(int *)((long)__ptr_00 + uVar4 * 4) = *(int *)((long)__ptr_00 + uVar4 * 4) + 1;
    uVar4 = (ulong)(uint)(*(int *)(in_RDX + (long)local_54 * 4) * 6 +
                         *(int *)(in_RSI + (long)local_54 * 4));
    *(int *)((long)__ptr_01 + uVar4 * 4) = *(int *)((long)__ptr_01 + uVar4 * 4) + 1;
  }
  dVar5 = (double)in_ECX;
  for (local_64 = 0; local_64 < 6; local_64 = local_64 + 1) {
    pdVar1[local_64] = (double)*(int *)((long)__ptr + (long)local_64 * 4) / dVar5;
  }
  for (local_68 = 0; local_68 < 6; local_68 = local_68 + 1) {
    pdVar2[local_68] = (double)*(int *)((long)__ptr_00 + (long)local_68 * 4) / dVar5;
  }
  for (local_6c = 0; local_6c < 0x24; local_6c = local_6c + 1) {
    pdVar3[local_6c] = (double)*(int *)((long)__ptr_01 + (long)local_6c * 4) / dVar5;
  }
  in_RDI->jointProbabilityVector = pdVar3;
  in_RDI->numJointStates = 0x24;
  in_RDI->firstProbabilityVector = pdVar1;
  in_RDI->numFirstStates = 6;
  in_RDI->secondProbabilityVector = pdVar2;
  in_RDI->numSecondStates = 6;
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return in_RDI;
}

Assistant:

JointProbabilityState calculateJointProbability(uint *firstVector, uint *secondVector, int vectorLength) {

  int firstNumStates = 6;
  int  secondNumStates = 6;
  int jointNumStates = firstNumStates * secondNumStates;
  
  int *firstStateCounts = (int *) calloc(firstNumStates,sizeof(int));
  int *secondStateCounts = (int *) calloc(secondNumStates,sizeof(int));
  int *jointStateCounts = (int *) calloc(jointNumStates,sizeof(int));
  
  double *firstStateProbs = (double *) calloc(firstNumStates,sizeof(double));
  double *secondStateProbs = (double *) calloc(secondNumStates,sizeof(double));
  double *jointStateProbs = (double *) calloc(jointNumStates,sizeof(double));
    
  /* Optimised for number of FP operations now O(states) instead of O(vectorLength) */
  for (int i = 0; i < vectorLength; ++i) {
    firstStateCounts[firstVector[i]] += 1;
    secondStateCounts[secondVector[i]] += 1;
    jointStateCounts[secondVector[i] * firstNumStates + firstVector[i]] += 1;
  }
  
  double length = vectorLength;
  for (int i = 0; i < firstNumStates; ++i) {
    firstStateProbs[i] = firstStateCounts[i] / length;
  }
  
  for (int i = 0; i < secondNumStates; i++) {
    secondStateProbs[i] = secondStateCounts[i] / length;
  }
  
  for (int i = 0; i < jointNumStates; i++) {
    jointStateProbs[i] = jointStateCounts[i] / length;
  }
  
  JointProbabilityState state;
  state.jointProbabilityVector = jointStateProbs;
  state.numJointStates = jointNumStates;
  state.firstProbabilityVector = firstStateProbs;
  state.numFirstStates = firstNumStates;
  state.secondProbabilityVector = secondStateProbs;
  state.numSecondStates = secondNumStates;
  
  free(firstStateCounts);
  free(secondStateCounts);
  free(jointStateCounts);

  return state;
}